

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truc_policy.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
FindInPackageParents(Package *package,CTransactionRef *ptx)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  element_type *peVar4;
  element_type *peVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  long in_FS_OFFSET;
  value_type *tx;
  CTxIn *input;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_package_parents;
  size_t i;
  const_iterator __end1;
  const_iterator __begin1;
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  possible_parents;
  CTransaction *in_stack_ffffffffffffff08;
  value_type *in_stack_ffffffffffffff10;
  __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff18;
  ulong local_60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff08);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffff08);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffff08);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff10);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff10);
  while (bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                           ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             *)in_stack_ffffffffffffff18,
                            (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             *)in_stack_ffffffffffffff10), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
              in_stack_ffffffffffffff08);
    std::
    set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
    ::insert((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               in_stack_ffffffffffffff08);
  }
  for (local_60 = 0;
      sVar3 = std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)in_stack_ffffffffffffff08), local_60 < sVar3; local_60 = local_60 + 1) {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::at((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_ffffffffffffff18,(size_type)in_stack_ffffffffffffff10);
    peVar4 = std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*(in_stack_ffffffffffffff18);
    peVar5 = std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*(in_stack_ffffffffffffff18);
    if (peVar4 == peVar5) break;
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff18 =
         (__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
         CTransaction::GetHash(in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff10 =
         (value_type *)
         std::
         set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         ::count((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    if (in_stack_ffffffffffffff10 != (value_type *)0x0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff18,
                 (value_type_conflict *)in_stack_ffffffffffffff10);
    }
  }
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffff08);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<size_t> FindInPackageParents(const Package& package, const CTransactionRef& ptx)
{
    std::vector<size_t> in_package_parents;

    std::set<Txid> possible_parents;
    for (auto &input : ptx->vin) {
        possible_parents.insert(input.prevout.hash);
    }

    for (size_t i{0}; i < package.size(); ++i) {
        const auto& tx = package.at(i);
        // We assume the package is sorted, so that we don't need to continue
        // looking past the transaction itself.
        if (&(*tx) == &(*ptx)) break;
        if (possible_parents.count(tx->GetHash())) {
            in_package_parents.push_back(i);
        }
    }
    return in_package_parents;
}